

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O1

void enet_protocol_notify_disconnect(ENetHost *host,ENetPeer *peer,ENetEvent *event)

{
  ENetPeerState EVar1;
  
  EVar1 = peer->state;
  if (ENET_PEER_STATE_ACKNOWLEDGING_CONNECT < EVar1) {
    host->recalculateBandwidthLimits = 1;
  }
  if (ENET_PEER_STATE_CONNECTION_PENDING < EVar1 || EVar1 == ENET_PEER_STATE_CONNECTING) {
    if (event == (ENetEvent *)0x0) {
      peer->eventData = 0;
      enet_protocol_dispatch_state(host,peer,ENET_PEER_STATE_ZOMBIE);
      return;
    }
    event->type = ENET_EVENT_TYPE_DISCONNECT;
    event->peer = peer;
    event->data = 0;
  }
  enet_peer_reset(peer);
  return;
}

Assistant:

static void
enet_protocol_notify_disconnect (ENetHost * host, ENetPeer * peer, ENetEvent * event)
{
    if (peer -> state >= ENET_PEER_STATE_CONNECTION_PENDING)
       host -> recalculateBandwidthLimits = 1;

    if (peer -> state != ENET_PEER_STATE_CONNECTING && peer -> state < ENET_PEER_STATE_CONNECTION_SUCCEEDED)
        enet_peer_reset (peer);
    else
    if (event != NULL)
    {
        event -> type = ENET_EVENT_TYPE_DISCONNECT;
        event -> peer = peer;
        event -> data = 0;

        enet_peer_reset (peer);
    }
    else 
    {
        peer -> eventData = 0;

        enet_protocol_dispatch_state (host, peer, ENET_PEER_STATE_ZOMBIE);
    }
}